

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Functional::IntegerStateQueryTests::init
          (IntegerStateQueryTests *this,EVP_PKEY_CTX *ctx)

{
  _func_int **pp_Var1;
  QueryType QVar2;
  TestContext *pTVar3;
  Context *pCVar4;
  int iVar5;
  GetBooleanVerifier *this_00;
  undefined4 extraout_var;
  GetIntegerVerifier *this_01;
  undefined4 extraout_var_00;
  StateVerifier *pSVar6;
  undefined4 extraout_var_01;
  ApiCase *pAVar7;
  long lVar8;
  StencilRefTestCase *pSVar9;
  StencilRefSeparateTestCase *pSVar10;
  StencilOpTestCase *pSVar11;
  TestNode *pTVar12;
  StencilFuncSeparateTestCase *pSVar13;
  StencilMaskTestCase *pSVar14;
  StencilMaskSeparateTestCase *pSVar15;
  StencilWriteMaskTestCase *pSVar16;
  StencilWriteMaskSeparateTestCase *pSVar17;
  PixelStoreAlignTestCase *pPVar18;
  BlendFuncTestCase *pBVar19;
  BlendEquationTestCase *pBVar20;
  ImplementationArrayTestCase *pIVar21;
  BufferBindingTestCase *pBVar22;
  BindingTest *pBVar23;
  TextureBindingTestCase *pTVar24;
  undefined8 *puVar25;
  long lVar26;
  int _verifierNdx;
  GLenum in_stack_fffffffffffffed8;
  IntegerStateQueryTests *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  allocator<char> local_d9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  StateVerifier *normalVerifiers [3];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  StateVerifier *implementationLimitVerifiers [2];
  
  this_00 = (GetBooleanVerifier *)operator_new(0x28);
  iVar5 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  IntegerStateQueryVerifiers::GetBooleanVerifier::GetBooleanVerifier
            (this_00,(Functions *)CONCAT44(extraout_var,iVar5),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  this->m_verifierBoolean = this_00;
  this_01 = (GetIntegerVerifier *)operator_new(0x28);
  iVar5 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  IntegerStateQueryVerifiers::GetIntegerVerifier::GetIntegerVerifier
            (this_01,(Functions *)CONCAT44(extraout_var_00,iVar5),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  this->m_verifierInteger = this_01;
  pSVar6 = (StateVerifier *)operator_new(0x28);
  iVar5 = (*((this->super_TestCaseGroup).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  IntegerStateQueryVerifiers::GetFloatVerifier::GetFloatVerifier
            ((GetFloatVerifier *)pSVar6,(Functions *)CONCAT44(extraout_var_01,iVar5),
             ((this->super_TestCaseGroup).m_context)->m_testCtx->m_log);
  this->m_verifierFloat = (GetFloatVerifier *)pSVar6;
  implementationLimitVerifiers[0] = &this->m_verifierBoolean->super_StateVerifier;
  implementationLimitVerifiers[1] = pSVar6;
  normalVerifiers[0] = &this->m_verifierBoolean->super_StateVerifier;
  normalVerifiers[1] = &this->m_verifierInteger->super_StateVerifier;
  normalVerifiers[2] = pSVar6;
  this_02 = this;
  for (lVar8 = 0; lVar8 != 0xb; lVar8 = lVar8 + 1) {
    for (lVar26 = 0; lVar26 != 2; lVar26 = lVar26 + 1) {
      pTVar3 = (TestContext *)implementationLimitVerifiers[lVar26];
      pAVar7 = (ApiCase *)operator_new(0xa8);
      pCVar4 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,(&PTR_anon_var_dwarf_349cf9_0071dfc0)[lVar8 * 3],
                 (allocator<char> *)&local_b8);
      std::operator+(&local_100,&local_d8,(char *)pTVar3->m_watchDog);
      pp_Var1 = (_func_int **)(&DAT_0071dfd0)[lVar8 * 3];
      ApiCase::ApiCase(pAVar7,pCVar4,local_100._M_dataplus._M_p,
                       (&PTR_anon_var_dwarf_38827b_0071dfc8)[lVar8 * 3]);
      (pAVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_0071e278;
      pAVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = pp_Var1;
      pAVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = pTVar3;
      tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pAVar7);
      std::__cxx11::string::~string((string *)&local_100);
      this = this_02;
      std::__cxx11::string::~string((string *)&local_d8);
      this_02 = this;
    }
  }
  for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
    pSVar6 = implementationLimitVerifiers[lVar8];
    pAVar7 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"sample_buffers",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
    ApiCase::ApiCase(pAVar7,pCVar4,local_100._M_dataplus._M_p,"SAMPLE_BUFFERS");
    (pAVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0071e2d0;
    pAVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pSVar6;
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pAVar7);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pSVar6 = normalVerifiers[lVar8];
    pAVar7 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"samples",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
    ApiCase::ApiCase(pAVar7,pCVar4,local_100._M_dataplus._M_p,"SAMPLES");
    (pAVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0071e328;
    pAVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pSVar6;
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pAVar7);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pTVar3 = (TestContext *)normalVerifiers[lVar8];
    pAVar7 = (ApiCase *)operator_new(0xa8);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"generate_mipmap_hint",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,(char *)pTVar3->m_watchDog);
    ApiCase::ApiCase(pAVar7,pCVar4,local_100._M_dataplus._M_p,"GENERATE_MIPMAP_HINT");
    (pAVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0071e380;
    *(undefined4 *)&pAVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = 0x8192;
    pAVar7[1].super_TestCase.super_TestCase.super_TestNode.m_testCtx = pTVar3;
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pAVar7);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pSVar6 = normalVerifiers[lVar8];
    pAVar7 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"depth_func",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
    ApiCase::ApiCase(pAVar7,pCVar4,local_100._M_dataplus._M_p,"DEPTH_FUNC");
    (pAVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0071e3d8;
    pAVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pSVar6;
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pAVar7);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pSVar6 = normalVerifiers[lVar8];
    pAVar7 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"cull_face_mode",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
    ApiCase::ApiCase(pAVar7,pCVar4,local_100._M_dataplus._M_p,"CULL_FACE_MODE");
    (pAVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0071e430;
    pAVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pSVar6;
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pAVar7);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pSVar6 = normalVerifiers[lVar8];
    pAVar7 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"front_face_mode",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
    ApiCase::ApiCase(pAVar7,pCVar4,local_100._M_dataplus._M_p,"FRONT_FACE");
    (pAVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0071e488;
    pAVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pSVar6;
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pAVar7);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pSVar6 = normalVerifiers[lVar8];
    pAVar7 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"viewport",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
    ApiCase::ApiCase(pAVar7,pCVar4,local_100._M_dataplus._M_p,"VIEWPORT");
    (pAVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0071e4e0;
    pAVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pSVar6;
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pAVar7);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pSVar6 = normalVerifiers[lVar8];
    pAVar7 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"scissor_box",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
    ApiCase::ApiCase(pAVar7,pCVar4,local_100._M_dataplus._M_p,"SCISSOR_BOX");
    (pAVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0071e538;
    pAVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pSVar6;
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pAVar7);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pSVar6 = normalVerifiers[lVar8];
    pAVar7 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"max_viewport_dims",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
    ApiCase::ApiCase(pAVar7,pCVar4,local_100._M_dataplus._M_p,"MAX_VIEWPORT_DIMS");
    (pAVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0071e590;
    pAVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pSVar6;
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pAVar7);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pSVar6 = normalVerifiers[lVar8];
    pAVar7 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"buffer_component_size",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
    ApiCase::ApiCase(pAVar7,pCVar4,local_100._M_dataplus._M_p,"x BITS");
    (pAVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0071e5e8;
    pAVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pSVar6;
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pAVar7);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pSVar6 = normalVerifiers[lVar8];
    pSVar9 = (StencilRefTestCase *)operator_new(0xa8);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"stencil_ref",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
    anon_unknown_2::StencilRefTestCase::StencilRefTestCase
              (pSVar9,pCVar4,pSVar6,local_100._M_dataplus._M_p,"STENCIL_REF",0xb97);
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pSVar9);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pSVar6 = normalVerifiers[lVar8];
    pSVar9 = (StencilRefTestCase *)operator_new(0xa8);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"stencil_back_ref",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
    anon_unknown_2::StencilRefTestCase::StencilRefTestCase
              (pSVar9,pCVar4,pSVar6,local_100._M_dataplus._M_p,"STENCIL_BACK_REF",0x8ca3);
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pSVar9);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pSVar6 = normalVerifiers[lVar8];
    pSVar10 = (StencilRefSeparateTestCase *)operator_new(0xa8);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"stencil_ref_separate",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
    in_stack_fffffffffffffed8 = 0x404;
    anon_unknown_2::StencilRefSeparateTestCase::StencilRefSeparateTestCase
              (pSVar10,pCVar4,pSVar6,local_100._M_dataplus._M_p,"STENCIL_REF (separate)",0xb97,0x404
              );
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pSVar10);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pSVar6 = normalVerifiers[lVar8];
    pSVar10 = (StencilRefSeparateTestCase *)operator_new(0xa8);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"stencil_ref_separate_both",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
    in_stack_fffffffffffffed8 = 0x408;
    anon_unknown_2::StencilRefSeparateTestCase::StencilRefSeparateTestCase
              (pSVar10,pCVar4,pSVar6,local_100._M_dataplus._M_p,"STENCIL_REF (separate)",0xb97,0x408
              );
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pSVar10);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pSVar6 = normalVerifiers[lVar8];
    pSVar10 = (StencilRefSeparateTestCase *)operator_new(0xa8);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"stencil_back_ref_separate",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
    in_stack_fffffffffffffed8 = 0x405;
    anon_unknown_2::StencilRefSeparateTestCase::StencilRefSeparateTestCase
              (pSVar10,pCVar4,pSVar6,local_100._M_dataplus._M_p,"STENCIL_BACK_REF (separate)",0x8ca3
               ,0x405);
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pSVar10);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pSVar6 = normalVerifiers[lVar8];
    pSVar10 = (StencilRefSeparateTestCase *)operator_new(0xa8);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"stencil_back_ref_separate_both",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
    in_stack_fffffffffffffed8 = 0x408;
    anon_unknown_2::StencilRefSeparateTestCase::StencilRefSeparateTestCase
              (pSVar10,pCVar4,pSVar6,local_100._M_dataplus._M_p,"STENCIL_BACK_REF (separate)",0x8ca3
               ,0x408);
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pSVar10);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    puVar25 = &DAT_0071e0d0 + lVar8 * 5;
    for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
      pSVar6 = normalVerifiers[lVar26];
      pSVar11 = (StencilOpTestCase *)operator_new(0xa8);
      pCVar4 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"stencil_",(allocator<char> *)&local_68);
      std::operator+(&local_d8,&local_b8,(char *)*puVar25);
      std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
      this = this_02;
      anon_unknown_2::StencilOpTestCase::StencilOpTestCase
                (pSVar11,pCVar4,pSVar6,local_100._M_dataplus._M_p,(char *)(&DAT_0071e0d8)[lVar8 * 5]
                 ,(&DAT_0071e0e0)[lVar8 * 10]);
      this_02 = this;
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar11);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
      pSVar6 = normalVerifiers[lVar26];
      pSVar11 = (StencilOpTestCase *)operator_new(0xa8);
      pCVar4 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,"stencil_back_",(allocator<char> *)&local_68);
      std::operator+(&local_d8,&local_b8,(char *)*puVar25);
      std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
      this = this_02;
      anon_unknown_2::StencilOpTestCase::StencilOpTestCase
                (pSVar11,pCVar4,pSVar6,local_100._M_dataplus._M_p,(char *)(&DAT_0071e0e8)[lVar8 * 5]
                 ,(&DAT_0071e0f0)[lVar8 * 10]);
      this_02 = this;
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)pSVar11);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
      pSVar6 = normalVerifiers[lVar26];
      pTVar12 = (TestNode *)operator_new(0xa8);
      pCVar4 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"stencil_",&local_d9);
      std::operator+(&local_b8,&local_68,(char *)*puVar25);
      std::operator+(&local_d8,&local_b8,"_separate_both");
      std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
      in_stack_fffffffffffffed8 = 0x408;
      this = this_02;
      anon_unknown_2::StencilOpSeparateTestCase::StencilOpSeparateTestCase
                ((StencilOpSeparateTestCase *)pTVar12,pCVar4,pSVar6,local_100._M_dataplus._M_p,
                 (char *)(&DAT_0071e0d8)[lVar8 * 5],(&DAT_0071e0e0)[lVar8 * 10],0x408);
      this_02 = this;
      tcu::TestNode::addChild((TestNode *)this,pTVar12);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_68);
    }
    for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
      pSVar6 = normalVerifiers[lVar26];
      pTVar12 = (TestNode *)operator_new(0xa8);
      pCVar4 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"stencil_back_",&local_d9);
      std::operator+(&local_b8,&local_68,(char *)*puVar25);
      std::operator+(&local_d8,&local_b8,"_separate_both");
      std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
      in_stack_fffffffffffffed8 = 0x408;
      this = this_02;
      anon_unknown_2::StencilOpSeparateTestCase::StencilOpSeparateTestCase
                ((StencilOpSeparateTestCase *)pTVar12,pCVar4,pSVar6,local_100._M_dataplus._M_p,
                 (char *)(&DAT_0071e0e8)[lVar8 * 5],(&DAT_0071e0f0)[lVar8 * 10],0x408);
      this_02 = this;
      tcu::TestNode::addChild((TestNode *)this,pTVar12);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_68);
    }
    for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
      pSVar6 = normalVerifiers[lVar26];
      pTVar12 = (TestNode *)operator_new(0xa8);
      pCVar4 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"stencil_",&local_d9);
      std::operator+(&local_b8,&local_68,(char *)*puVar25);
      std::operator+(&local_d8,&local_b8,"_separate");
      std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
      in_stack_fffffffffffffed8 = 0x404;
      this = this_02;
      anon_unknown_2::StencilOpSeparateTestCase::StencilOpSeparateTestCase
                ((StencilOpSeparateTestCase *)pTVar12,pCVar4,pSVar6,local_100._M_dataplus._M_p,
                 (char *)(&DAT_0071e0d8)[lVar8 * 5],(&DAT_0071e0e0)[lVar8 * 10],0x404);
      this_02 = this;
      tcu::TestNode::addChild((TestNode *)this,pTVar12);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_68);
    }
    for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
      pSVar6 = normalVerifiers[lVar26];
      pTVar12 = (TestNode *)operator_new(0xa8);
      pCVar4 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_68,"stencil_back_",&local_d9);
      std::operator+(&local_b8,&local_68,(char *)*puVar25);
      std::operator+(&local_d8,&local_b8,"_separate");
      std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
      in_stack_fffffffffffffed8 = 0x405;
      this = this_02;
      anon_unknown_2::StencilOpSeparateTestCase::StencilOpSeparateTestCase
                ((StencilOpSeparateTestCase *)pTVar12,pCVar4,pSVar6,local_100._M_dataplus._M_p,
                 (char *)(&DAT_0071e0e8)[lVar8 * 5],(&DAT_0071e0f0)[lVar8 * 10],0x405);
      this_02 = this;
      tcu::TestNode::addChild((TestNode *)this,pTVar12);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_68);
    }
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pSVar6 = normalVerifiers[lVar8];
    pAVar7 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"stencil_func",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
    ApiCase::ApiCase(pAVar7,pCVar4,local_100._M_dataplus._M_p,"STENCIL_FUNC");
    (pAVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0071e7b0;
    pAVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pSVar6;
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pAVar7);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pSVar6 = normalVerifiers[lVar8];
    pSVar13 = (StencilFuncSeparateTestCase *)operator_new(0xa8);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"stencil_func_separate",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
    anon_unknown_2::StencilFuncSeparateTestCase::StencilFuncSeparateTestCase
              (pSVar13,pCVar4,pSVar6,local_100._M_dataplus._M_p,(char *)0xb92,0x404,
               in_stack_fffffffffffffed8);
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pSVar13);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pSVar6 = normalVerifiers[lVar8];
    pSVar13 = (StencilFuncSeparateTestCase *)operator_new(0xa8);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"stencil_func_separate_both",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
    anon_unknown_2::StencilFuncSeparateTestCase::StencilFuncSeparateTestCase
              (pSVar13,pCVar4,pSVar6,local_100._M_dataplus._M_p,(char *)0xb92,0x408,
               in_stack_fffffffffffffed8);
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pSVar13);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pSVar6 = normalVerifiers[lVar8];
    pSVar13 = (StencilFuncSeparateTestCase *)operator_new(0xa8);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"stencil_back_func_separate",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
    anon_unknown_2::StencilFuncSeparateTestCase::StencilFuncSeparateTestCase
              (pSVar13,pCVar4,pSVar6,local_100._M_dataplus._M_p,(char *)0x8800,0x405,
               in_stack_fffffffffffffed8);
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pSVar13);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pSVar6 = normalVerifiers[lVar8];
    pSVar13 = (StencilFuncSeparateTestCase *)operator_new(0xa8);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"stencil_back_func_separate_both",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
    anon_unknown_2::StencilFuncSeparateTestCase::StencilFuncSeparateTestCase
              (pSVar13,pCVar4,pSVar6,local_100._M_dataplus._M_p,(char *)0x8800,0x408,
               in_stack_fffffffffffffed8);
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pSVar13);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pSVar6 = normalVerifiers[lVar8];
    pSVar14 = (StencilMaskTestCase *)operator_new(0xa8);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"stencil_value_mask",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
    anon_unknown_2::StencilMaskTestCase::StencilMaskTestCase
              (pSVar14,pCVar4,pSVar6,local_100._M_dataplus._M_p,"STENCIL_VALUE_MASK",0xb93);
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pSVar14);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pSVar6 = normalVerifiers[lVar8];
    pSVar14 = (StencilMaskTestCase *)operator_new(0xa8);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"stencil_back_value_mask",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
    anon_unknown_2::StencilMaskTestCase::StencilMaskTestCase
              (pSVar14,pCVar4,pSVar6,local_100._M_dataplus._M_p,"STENCIL_BACK_VALUE_MASK",0x8ca4);
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pSVar14);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pSVar6 = normalVerifiers[lVar8];
    pSVar15 = (StencilMaskSeparateTestCase *)operator_new(0xa8);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"stencil_value_mask_separate",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
    anon_unknown_2::StencilMaskSeparateTestCase::StencilMaskSeparateTestCase
              (pSVar15,pCVar4,pSVar6,local_100._M_dataplus._M_p,"STENCIL_VALUE_MASK (separate)",
               0xb93,0x404);
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pSVar15);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pSVar6 = normalVerifiers[lVar8];
    pSVar15 = (StencilMaskSeparateTestCase *)operator_new(0xa8);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"stencil_value_mask_separate_both",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
    anon_unknown_2::StencilMaskSeparateTestCase::StencilMaskSeparateTestCase
              (pSVar15,pCVar4,pSVar6,local_100._M_dataplus._M_p,"STENCIL_VALUE_MASK (separate)",
               0xb93,0x408);
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pSVar15);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pSVar6 = normalVerifiers[lVar8];
    pSVar15 = (StencilMaskSeparateTestCase *)operator_new(0xa8);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"stencil_back_value_mask_separate",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
    anon_unknown_2::StencilMaskSeparateTestCase::StencilMaskSeparateTestCase
              (pSVar15,pCVar4,pSVar6,local_100._M_dataplus._M_p,"STENCIL_BACK_VALUE_MASK (separate)"
               ,0x8ca4,0x405);
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pSVar15);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pSVar6 = normalVerifiers[lVar8];
    pSVar15 = (StencilMaskSeparateTestCase *)operator_new(0xa8);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"stencil_back_value_mask_separate_both",
               (allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
    anon_unknown_2::StencilMaskSeparateTestCase::StencilMaskSeparateTestCase
              (pSVar15,pCVar4,pSVar6,local_100._M_dataplus._M_p,"STENCIL_BACK_VALUE_MASK (separate)"
               ,0x8ca4,0x408);
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pSVar15);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pSVar6 = normalVerifiers[lVar8];
    pSVar16 = (StencilWriteMaskTestCase *)operator_new(0xa8);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"stencil_writemask",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
    anon_unknown_2::StencilWriteMaskTestCase::StencilWriteMaskTestCase
              (pSVar16,pCVar4,pSVar6,local_100._M_dataplus._M_p,"STENCIL_WRITEMASK",0xb98);
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pSVar16);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pSVar6 = normalVerifiers[lVar8];
    pSVar16 = (StencilWriteMaskTestCase *)operator_new(0xa8);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"stencil_back_writemask",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
    anon_unknown_2::StencilWriteMaskTestCase::StencilWriteMaskTestCase
              (pSVar16,pCVar4,pSVar6,local_100._M_dataplus._M_p,"STENCIL_BACK_WRITEMASK",0x8ca5);
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pSVar16);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pSVar6 = normalVerifiers[lVar8];
    pSVar17 = (StencilWriteMaskSeparateTestCase *)operator_new(0xa8);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"stencil_writemask_separate",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
    anon_unknown_2::StencilWriteMaskSeparateTestCase::StencilWriteMaskSeparateTestCase
              (pSVar17,pCVar4,pSVar6,local_100._M_dataplus._M_p,"STENCIL_WRITEMASK (separate)",0xb98
               ,0x404);
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pSVar17);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pSVar6 = normalVerifiers[lVar8];
    pSVar17 = (StencilWriteMaskSeparateTestCase *)operator_new(0xa8);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"stencil_writemask_separate_both",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
    anon_unknown_2::StencilWriteMaskSeparateTestCase::StencilWriteMaskSeparateTestCase
              (pSVar17,pCVar4,pSVar6,local_100._M_dataplus._M_p,"STENCIL_WRITEMASK (separate)",0xb98
               ,0x408);
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pSVar17);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pSVar6 = normalVerifiers[lVar8];
    pSVar17 = (StencilWriteMaskSeparateTestCase *)operator_new(0xa8);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"stencil_back_writemask_separate",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
    anon_unknown_2::StencilWriteMaskSeparateTestCase::StencilWriteMaskSeparateTestCase
              (pSVar17,pCVar4,pSVar6,local_100._M_dataplus._M_p,"STENCIL_BACK_WRITEMASK (separate)",
               0x8ca5,0x405);
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pSVar17);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pSVar6 = normalVerifiers[lVar8];
    pSVar17 = (StencilWriteMaskSeparateTestCase *)operator_new(0xa8);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"stencil_back_writemask_separate_both",
               (allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
    anon_unknown_2::StencilWriteMaskSeparateTestCase::StencilWriteMaskSeparateTestCase
              (pSVar17,pCVar4,pSVar6,local_100._M_dataplus._M_p,"STENCIL_BACK_WRITEMASK (separate)",
               0x8ca5,0x408);
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pSVar17);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pSVar6 = normalVerifiers[lVar8];
    pPVar18 = (PixelStoreAlignTestCase *)operator_new(0xa8);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"unpack_alignment",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
    anon_unknown_2::PixelStoreAlignTestCase::PixelStoreAlignTestCase
              (pPVar18,pCVar4,pSVar6,local_100._M_dataplus._M_p,"UNPACK_ALIGNMENT",0xcf5);
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pPVar18);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pSVar6 = normalVerifiers[lVar8];
    pPVar18 = (PixelStoreAlignTestCase *)operator_new(0xa8);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"pack_alignment",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
    anon_unknown_2::PixelStoreAlignTestCase::PixelStoreAlignTestCase
              (pPVar18,pCVar4,pSVar6,local_100._M_dataplus._M_p,"PACK_ALIGNMENT",0xd05);
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pPVar18);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
    this = this_02;
    for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
      pSVar6 = normalVerifiers[lVar26];
      pBVar19 = (BlendFuncTestCase *)operator_new(0xa8);
      pCVar4 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,(&PTR_anon_var_dwarf_3887ec_0071e150)[lVar8 * 3],
                 (allocator<char> *)&local_b8);
      std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
      anon_unknown_2::BlendFuncTestCase::BlendFuncTestCase
                (pBVar19,pCVar4,pSVar6,local_100._M_dataplus._M_p,(char *)(&DAT_0071e158)[lVar8 * 3]
                 ,(&DAT_0071e160)[lVar8 * 6],(&DAT_0071e164)[lVar8 * 6]);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar19);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
      pSVar6 = normalVerifiers[lVar26];
      pBVar19 = (BlendFuncTestCase *)operator_new(0xa8);
      pCVar4 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,(&PTR_anon_var_dwarf_3887ec_0071e150)[lVar8 * 3],
                 (allocator<char> *)&local_68);
      std::operator+(&local_d8,&local_b8,"_separate");
      std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
      anon_unknown_2::BlendFuncTestCase::BlendFuncTestCase
                (pBVar19,pCVar4,pSVar6,local_100._M_dataplus._M_p,(char *)(&DAT_0071e158)[lVar8 * 3]
                 ,(&DAT_0071e160)[lVar8 * 6],(&DAT_0071e164)[lVar8 * 6]);
      (pBVar19->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_0071ea78;
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar19);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 2; lVar8 = lVar8 + 1) {
    this = this_02;
    for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
      pSVar6 = normalVerifiers[lVar26];
      pBVar20 = (BlendEquationTestCase *)operator_new(0xa8);
      pCVar4 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_d8,(&PTR_anon_var_dwarf_388845_0071e1b0)[lVar8 * 3],
                 (allocator<char> *)&local_b8);
      std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
      anon_unknown_2::BlendEquationTestCase::BlendEquationTestCase
                (pBVar20,pCVar4,pSVar6,local_100._M_dataplus._M_p,(char *)(&DAT_0071e1b8)[lVar8 * 3]
                 ,(&DAT_0071e1c0)[lVar8 * 6],(&DAT_0071e1c4)[lVar8 * 6]);
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar20);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_d8);
    }
    for (lVar26 = 0; lVar26 != 3; lVar26 = lVar26 + 1) {
      pSVar6 = normalVerifiers[lVar26];
      pBVar20 = (BlendEquationTestCase *)operator_new(0xa8);
      pCVar4 = (this->super_TestCaseGroup).m_context;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b8,(&PTR_anon_var_dwarf_388845_0071e1b0)[lVar8 * 3],
                 (allocator<char> *)&local_68);
      std::operator+(&local_d8,&local_b8,"_separate");
      std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
      anon_unknown_2::BlendEquationTestCase::BlendEquationTestCase
                (pBVar20,pCVar4,pSVar6,local_100._M_dataplus._M_p,(char *)(&DAT_0071e1b8)[lVar8 * 3]
                 ,(&DAT_0071e1c0)[lVar8 * 6],(&DAT_0071e1c4)[lVar8 * 6]);
      (pBVar20->super_ApiCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
           (_func_int **)&PTR__ApiCase_0071eb38;
      tcu::TestNode::addChild((TestNode *)this,(TestNode *)pBVar20);
      std::__cxx11::string::~string((string *)&local_100);
      std::__cxx11::string::~string((string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pSVar6 = normalVerifiers[lVar8];
    pIVar21 = (ImplementationArrayTestCase *)operator_new(0xb0);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"compressed_texture_formats",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
    anon_unknown_2::ImplementationArrayTestCase::ImplementationArrayTestCase
              (pIVar21,pCVar4,pSVar6,local_100._M_dataplus._M_p,"COMPRESSED_TEXTURE_FORMATS",0x86a3,
               0x86a2,(int)this_02);
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pIVar21);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pSVar6 = normalVerifiers[lVar8];
    pIVar21 = (ImplementationArrayTestCase *)operator_new(0xb0);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"shader_binary_formats",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
    anon_unknown_2::ImplementationArrayTestCase::ImplementationArrayTestCase
              (pIVar21,pCVar4,pSVar6,local_100._M_dataplus._M_p,"SHADER_BINARY_FORMATS",0x8df8,
               0x8df9,(int)this_02);
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pIVar21);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 0xc; lVar8 = lVar8 + 4) {
    QVar2 = *(QueryType *)((long)init::queryTypes + lVar8);
    pBVar22 = (BufferBindingTestCase *)operator_new(0x88);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"array_buffer_binding",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,(&PTR_anon_var_dwarf_374f39_0071eef8)[(int)QVar2]);
    anon_unknown_2::BufferBindingTestCase::BufferBindingTestCase
              (pBVar22,pCVar4,QVar2,local_100._M_dataplus._M_p,"ARRAY_BUFFER_BINDING",0x8894,0x8892)
    ;
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pBVar22);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 0xc; lVar8 = lVar8 + 4) {
    QVar2 = *(QueryType *)((long)init::queryTypes + lVar8);
    pBVar22 = (BufferBindingTestCase *)operator_new(0x88);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"element_array_buffer_binding",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,(&PTR_anon_var_dwarf_374f39_0071eef8)[(int)QVar2]);
    anon_unknown_2::BufferBindingTestCase::BufferBindingTestCase
              (pBVar22,pCVar4,QVar2,local_100._M_dataplus._M_p,"ELEMENT_ARRAY_BUFFER_BINDING",0x8895
               ,0x8893);
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pBVar22);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 0xc; lVar8 = lVar8 + 4) {
    QVar2 = *(QueryType *)((long)init::queryTypes + lVar8);
    pBVar23 = (BindingTest *)operator_new(0x80);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"current_program_binding",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,(&PTR_anon_var_dwarf_374f39_0071eef8)[(int)QVar2]);
    anon_unknown_2::BindingTest::BindingTest
              (pBVar23,pCVar4,local_100._M_dataplus._M_p,"CURRENT_PROGRAM",QVar2);
    (pBVar23->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TestCase_0071eca0;
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pBVar23);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pSVar6 = normalVerifiers[lVar8];
    pAVar7 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"stencil_clear_value",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
    ApiCase::ApiCase(pAVar7,pCVar4,local_100._M_dataplus._M_p,"STENCIL_CLEAR_VALUE");
    (pAVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0071ecf8;
    pAVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pSVar6;
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pAVar7);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pSVar6 = normalVerifiers[lVar8];
    pAVar7 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"active_texture",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
    ApiCase::ApiCase(pAVar7,pCVar4,local_100._M_dataplus._M_p,"ACTIVE_TEXTURE");
    (pAVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0071ed50;
    pAVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pSVar6;
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pAVar7);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 0xc; lVar8 = lVar8 + 4) {
    QVar2 = *(QueryType *)((long)init::queryTypes + lVar8);
    pBVar23 = (BindingTest *)operator_new(0x80);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"renderbuffer_binding",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,(&PTR_anon_var_dwarf_374f39_0071eef8)[(int)QVar2]);
    anon_unknown_2::BindingTest::BindingTest
              (pBVar23,pCVar4,local_100._M_dataplus._M_p,"RENDERBUFFER_BINDING",QVar2);
    (pBVar23->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TestCase_0071eda8;
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pBVar23);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 0xc; lVar8 = lVar8 + 4) {
    QVar2 = *(QueryType *)((long)init::queryTypes + lVar8);
    pTVar24 = (TextureBindingTestCase *)operator_new(0x88);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"texture_binding_2d",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,(&PTR_anon_var_dwarf_374f39_0071eef8)[(int)QVar2]);
    anon_unknown_2::TextureBindingTestCase::TextureBindingTestCase
              (pTVar24,pCVar4,QVar2,local_100._M_dataplus._M_p,"TEXTURE_BINDING_2D",0x8069,0xde1);
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pTVar24);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 0xc; lVar8 = lVar8 + 4) {
    QVar2 = *(QueryType *)((long)init::queryTypes + lVar8);
    pTVar24 = (TextureBindingTestCase *)operator_new(0x88);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"texture_binding_cube_map",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,(&PTR_anon_var_dwarf_374f39_0071eef8)[(int)QVar2]);
    anon_unknown_2::TextureBindingTestCase::TextureBindingTestCase
              (pTVar24,pCVar4,QVar2,local_100._M_dataplus._M_p,"TEXTURE_BINDING_CUBE_MAP",0x8514,
               0x8513);
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pTVar24);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 0xc; lVar8 = lVar8 + 4) {
    QVar2 = *(QueryType *)((long)init::queryTypes + lVar8);
    pBVar23 = (BindingTest *)operator_new(0x80);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"framebuffer_binding",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,(&PTR_anon_var_dwarf_374f39_0071eef8)[(int)QVar2]);
    anon_unknown_2::BindingTest::BindingTest
              (pBVar23,pCVar4,local_100._M_dataplus._M_p,
               "DRAW_FRAMEBUFFER_BINDING and READ_FRAMEBUFFER_BINDING",QVar2);
    (pBVar23->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TestCase_0071ee58;
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pBVar23);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  for (lVar8 = 0; lVar8 != 3; lVar8 = lVar8 + 1) {
    pSVar6 = normalVerifiers[lVar8];
    pAVar7 = (ApiCase *)operator_new(0xa0);
    pCVar4 = (this->super_TestCaseGroup).m_context;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_d8,"implementation_color_read",(allocator<char> *)&local_b8);
    std::operator+(&local_100,&local_d8,pSVar6->m_testNamePostfix);
    ApiCase::ApiCase(pAVar7,pCVar4,local_100._M_dataplus._M_p,
                     "IMPLEMENTATION_COLOR_READ_TYPE and IMPLEMENTATION_COLOR_READ_FORMAT");
    (pAVar7->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__ApiCase_0071eeb0;
    pAVar7[1].super_TestCase.super_TestCase.super_TestNode._vptr_TestNode = (_func_int **)pSVar6;
    tcu::TestNode::addChild((TestNode *)this_02,(TestNode *)pAVar7);
    std::__cxx11::string::~string((string *)&local_100);
    this = this_02;
    std::__cxx11::string::~string((string *)&local_d8);
    this_02 = this;
  }
  return 3;
}

Assistant:

void IntegerStateQueryTests::init (void)
{
	static const QueryType queryTypes[] =
	{
		QUERY_BOOLEAN,
		QUERY_INTEGER,
		QUERY_FLOAT,
	};

	DE_ASSERT(m_verifierBoolean == DE_NULL);
	DE_ASSERT(m_verifierInteger == DE_NULL);
	DE_ASSERT(m_verifierFloat == DE_NULL);

	m_verifierBoolean		= new GetBooleanVerifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierInteger		= new GetIntegerVerifier	(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());
	m_verifierFloat			= new GetFloatVerifier		(m_context.getRenderContext().getFunctions(), m_context.getTestContext().getLog());

	const struct LimitedStateInteger
	{
		const char*		name;
		const char*		description;
		GLenum			targetName;
		GLint			value;
	} implementationMinLimits[] =
	{
		{ "subpixel_bits",						"SUBPIXEL_BITS has  a minimum value of 4",						GL_SUBPIXEL_BITS,						4	},
		{ "max_texture_size",					"MAX_TEXTURE_SIZE has  a minimum value of 64",					GL_MAX_TEXTURE_SIZE,					64	},
		{ "max_cube_map_texture_size",			"MAX_CUBE_MAP_TEXTURE_SIZE has  a minimum value of 16",			GL_MAX_CUBE_MAP_TEXTURE_SIZE,			16	},
		{ "max_vertex_attribs",					"MAX_VERTEX_ATTRIBS has  a minimum value of 8",					GL_MAX_VERTEX_ATTRIBS,					8	},
		{ "max_vertex_uniform_vectors",			"MAX_VERTEX_UNIFORM_VECTORS has  a minimum value of 128",		GL_MAX_VERTEX_UNIFORM_VECTORS,			128	},
		{ "max_varying_vectors",				"MAX_VARYING_VECTORS has  a minimum value of 8",				GL_MAX_VARYING_VECTORS,					8	},
		{ "max_combined_texture_image_units",	"MAX_COMBINED_TEXTURE_IMAGE_UNITS has  a minimum value of 8",	GL_MAX_COMBINED_TEXTURE_IMAGE_UNITS,	8	},
		{ "max_vertex_texture_image_units",		"MAX_VERTEX_TEXTURE_IMAGE_UNITS has  a minimum value of 0",		GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS,		0	},
		{ "max_texture_image_units",			"MAX_TEXTURE_IMAGE_UNITS has  a minimum value of 8",			GL_MAX_TEXTURE_IMAGE_UNITS,				8	},
		{ "max_fragment_uniform_vectors",		"MAX_FRAGMENT_UNIFORM_VECTORS has  a minimum value of 16",		GL_MAX_FRAGMENT_UNIFORM_VECTORS,		16	},
		{ "max_renderbuffer_size",				"MAX_RENDERBUFFER_SIZE has  a minimum value of 1",				GL_MAX_RENDERBUFFER_SIZE,				1	},
	};

	// \note implementation defined limits have their own tests so just check the conversions to boolean and float
	StateVerifier* implementationLimitVerifiers[]	= {m_verifierBoolean,						m_verifierFloat};
	StateVerifier* normalVerifiers[]				= {m_verifierBoolean,	m_verifierInteger,	m_verifierFloat};

	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(implementationMinLimits); testNdx++)
		FOR_EACH_VERIFIER(implementationLimitVerifiers, addChild(new ConstantMinimumValueTestCase(m_context, verifier, (std::string(implementationMinLimits[testNdx].name) + verifier->getTestNamePostfix()).c_str(), implementationMinLimits[testNdx].description, implementationMinLimits[testNdx].targetName, implementationMinLimits[testNdx].value)));

	FOR_EACH_VERIFIER(implementationLimitVerifiers, addChild(new SampleBuffersTestCase		(m_context,	 verifier, (std::string("sample_buffers")						+ verifier->getTestNamePostfix()).c_str(),		"SAMPLE_BUFFERS")));

	FOR_EACH_VERIFIER(normalVerifiers, addChild(new SamplesTestCase				(m_context,	 verifier, (std::string("samples")								+ verifier->getTestNamePostfix()).c_str(),		"SAMPLES")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new HintTestCase				(m_context,	 verifier, (std::string("generate_mipmap_hint")					+ verifier->getTestNamePostfix()).c_str(),		"GENERATE_MIPMAP_HINT",				GL_GENERATE_MIPMAP_HINT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new DepthFuncTestCase			(m_context,	 verifier, (std::string("depth_func")							+ verifier->getTestNamePostfix()).c_str(),		"DEPTH_FUNC")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new CullFaceTestCase			(m_context,	 verifier, (std::string("cull_face_mode")						+ verifier->getTestNamePostfix()).c_str(),		"CULL_FACE_MODE")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new FrontFaceTestCase			(m_context,	 verifier, (std::string("front_face_mode")						+ verifier->getTestNamePostfix()).c_str(),		"FRONT_FACE")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ViewPortTestCase			(m_context,	 verifier, (std::string("viewport")								+ verifier->getTestNamePostfix()).c_str(),		"VIEWPORT")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ScissorBoxTestCase			(m_context,	 verifier, (std::string("scissor_box")							+ verifier->getTestNamePostfix()).c_str(),		"SCISSOR_BOX")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new MaxViewportDimsTestCase		(m_context,	 verifier, (std::string("max_viewport_dims")					+ verifier->getTestNamePostfix()).c_str(),		"MAX_VIEWPORT_DIMS")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new BufferComponentSizeCase		(m_context,	 verifier, (std::string("buffer_component_size")				+ verifier->getTestNamePostfix()).c_str(),		"x BITS")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefTestCase			(m_context,	 verifier, (std::string("stencil_ref")							+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_REF",						GL_STENCIL_REF)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefTestCase			(m_context,	 verifier, (std::string("stencil_back_ref")						+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_BACK_REF",					GL_STENCIL_BACK_REF)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefSeparateTestCase	(m_context,	 verifier, (std::string("stencil_ref_separate")					+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_REF (separate)",			GL_STENCIL_REF,			GL_FRONT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefSeparateTestCase	(m_context,	 verifier, (std::string("stencil_ref_separate_both")			+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_REF (separate)",			GL_STENCIL_REF,			GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefSeparateTestCase	(m_context,	 verifier, (std::string("stencil_back_ref_separate")			+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_BACK_REF (separate)",		GL_STENCIL_BACK_REF,	GL_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilRefSeparateTestCase	(m_context,	 verifier, (std::string("stencil_back_ref_separate_both")		+ verifier->getTestNamePostfix()).c_str(),		"STENCIL_BACK_REF (separate)",		GL_STENCIL_BACK_REF,	GL_FRONT_AND_BACK)));

	const struct NamedStencilOp
	{
		const char*		name;

		const char*		frontDescription;
		GLenum			frontTarget;
		const char*		backDescription;
		GLenum			backTarget;
	} stencilOps[] =
	{
		{ "fail",		"STENCIL_FAIL",				GL_STENCIL_FAIL,			"STENCIL_BACK_FAIL",			GL_STENCIL_BACK_FAIL			},
		{ "depth_fail",	"STENCIL_PASS_DEPTH_FAIL",	GL_STENCIL_PASS_DEPTH_FAIL,	"STENCIL_BACK_PASS_DEPTH_FAIL",	GL_STENCIL_BACK_PASS_DEPTH_FAIL	},
		{ "depth_pass",	"STENCIL_PASS_DEPTH_PASS",	GL_STENCIL_PASS_DEPTH_PASS,	"STENCIL_BACK_PASS_DEPTH_PASS",	GL_STENCIL_BACK_PASS_DEPTH_PASS	}
	};

	for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(stencilOps); testNdx++)
	{
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpTestCase			(m_context, verifier, (std::string("stencil_")		+ stencilOps[testNdx].name + verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].frontDescription,	stencilOps[testNdx].frontTarget)));
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpTestCase			(m_context, verifier, (std::string("stencil_back_")	+ stencilOps[testNdx].name + verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].backDescription,	stencilOps[testNdx].backTarget)));

		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpSeparateTestCase	(m_context, verifier, (std::string("stencil_")		+ stencilOps[testNdx].name + "_separate_both"	+ verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].frontDescription,	stencilOps[testNdx].frontTarget,	GL_FRONT_AND_BACK)));
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpSeparateTestCase	(m_context, verifier, (std::string("stencil_back_")	+ stencilOps[testNdx].name + "_separate_both"	+ verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].backDescription,		stencilOps[testNdx].backTarget,		GL_FRONT_AND_BACK)));

		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpSeparateTestCase	(m_context, verifier, (std::string("stencil_")		+ stencilOps[testNdx].name + "_separate"		+ verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].frontDescription,	stencilOps[testNdx].frontTarget,	GL_FRONT)));
		FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilOpSeparateTestCase	(m_context, verifier, (std::string("stencil_back_")	+ stencilOps[testNdx].name + "_separate"		+ verifier->getTestNamePostfix()).c_str(), stencilOps[testNdx].backDescription,		stencilOps[testNdx].backTarget,		GL_BACK)));
	}

	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilFuncTestCase					(m_context, verifier,	(std::string("stencil_func")								+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_FUNC")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilFuncSeparateTestCase			(m_context, verifier,	(std::string("stencil_func_separate")						+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_FUNC (separate)",				GL_STENCIL_FUNC,				GL_FRONT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilFuncSeparateTestCase			(m_context, verifier,	(std::string("stencil_func_separate_both")					+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_FUNC (separate)",				GL_STENCIL_FUNC,				GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilFuncSeparateTestCase			(m_context, verifier,	(std::string("stencil_back_func_separate")					+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_FUNC (separate)",				GL_STENCIL_BACK_FUNC,			GL_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilFuncSeparateTestCase			(m_context, verifier,	(std::string("stencil_back_func_separate_both")				+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_FUNC (separate)",				GL_STENCIL_BACK_FUNC,			GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskTestCase					(m_context, verifier,	(std::string("stencil_value_mask")							+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_VALUE_MASK",					GL_STENCIL_VALUE_MASK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskTestCase					(m_context, verifier,	(std::string("stencil_back_value_mask")						+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_VALUE_MASK",				GL_STENCIL_BACK_VALUE_MASK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskSeparateTestCase			(m_context, verifier,	(std::string("stencil_value_mask_separate")					+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_VALUE_MASK (separate)",		GL_STENCIL_VALUE_MASK,			GL_FRONT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskSeparateTestCase			(m_context, verifier,	(std::string("stencil_value_mask_separate_both")			+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_VALUE_MASK (separate)",		GL_STENCIL_VALUE_MASK,			GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskSeparateTestCase			(m_context, verifier,	(std::string("stencil_back_value_mask_separate")			+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_VALUE_MASK (separate)",	GL_STENCIL_BACK_VALUE_MASK,		GL_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilMaskSeparateTestCase			(m_context, verifier,	(std::string("stencil_back_value_mask_separate_both")		+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_VALUE_MASK (separate)",	GL_STENCIL_BACK_VALUE_MASK,		GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskTestCase			(m_context, verifier,	(std::string("stencil_writemask")							+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_WRITEMASK",					GL_STENCIL_WRITEMASK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskTestCase			(m_context, verifier,	(std::string("stencil_back_writemask")						+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_WRITEMASK",				GL_STENCIL_BACK_WRITEMASK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskSeparateTestCase	(m_context, verifier,	(std::string("stencil_writemask_separate")					+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_WRITEMASK (separate)",			GL_STENCIL_WRITEMASK,			GL_FRONT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskSeparateTestCase	(m_context, verifier,	(std::string("stencil_writemask_separate_both")				+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_WRITEMASK (separate)",			GL_STENCIL_WRITEMASK,			GL_FRONT_AND_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskSeparateTestCase	(m_context, verifier,	(std::string("stencil_back_writemask_separate")				+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_WRITEMASK (separate)",	GL_STENCIL_BACK_WRITEMASK,		GL_BACK)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilWriteMaskSeparateTestCase	(m_context, verifier,	(std::string("stencil_back_writemask_separate_both")		+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_BACK_WRITEMASK (separate)",	GL_STENCIL_BACK_WRITEMASK,		GL_FRONT_AND_BACK)));

	FOR_EACH_VERIFIER(normalVerifiers, addChild(new PixelStoreAlignTestCase(m_context, verifier, (std::string("unpack_alignment")	+ verifier->getTestNamePostfix()).c_str(),	"UNPACK_ALIGNMENT",	GL_UNPACK_ALIGNMENT)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new PixelStoreAlignTestCase(m_context, verifier, (std::string("pack_alignment")		+ verifier->getTestNamePostfix()).c_str(),	"PACK_ALIGNMENT",	GL_PACK_ALIGNMENT)));

	{
		const struct BlendColorState
		{
			const char*	name;
			const char*	description;
			GLenum		target;
			int			initialValue;
		} blendColorStates[] =
		{
			{ "blend_src_rgb",		"BLEND_SRC_RGB",	GL_BLEND_SRC_RGB,		GL_ONE	},
			{ "blend_src_alpha",	"BLEND_SRC_ALPHA",	GL_BLEND_SRC_ALPHA,		GL_ONE	},
			{ "blend_dst_rgb",		"BLEND_DST_RGB",	GL_BLEND_DST_RGB,		GL_ZERO	},
			{ "blend_dst_alpha",	"BLEND_DST_ALPHA",	GL_BLEND_DST_ALPHA,		GL_ZERO	}
		};
		for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(blendColorStates); testNdx++)
		{
			FOR_EACH_VERIFIER(normalVerifiers, addChild(new BlendFuncTestCase			(m_context, verifier, (std::string(blendColorStates[testNdx].name)					+ verifier->getTestNamePostfix()).c_str(),	blendColorStates[testNdx].description,	blendColorStates[testNdx].target,	blendColorStates[testNdx].initialValue)));
			FOR_EACH_VERIFIER(normalVerifiers, addChild(new BlendFuncSeparateTestCase	(m_context, verifier, (std::string(blendColorStates[testNdx].name) + "_separate"	+ verifier->getTestNamePostfix()).c_str(),	blendColorStates[testNdx].description,	blendColorStates[testNdx].target,	blendColorStates[testNdx].initialValue)));
		}
	}

	{
		const struct BlendEquationState
		{
			const char*	name;
			const char*	description;
			GLenum		target;
			int			initialValue;
		} blendEquationStates[] =
		{
			{ "blend_equation_rgb",		"BLEND_EQUATION_RGB",	GL_BLEND_EQUATION_RGB,		GL_FUNC_ADD	},
			{ "blend_equation_alpha",	"BLEND_EQUATION_ALPHA",	GL_BLEND_EQUATION_ALPHA,	GL_FUNC_ADD	}
		};
		for (int testNdx = 0; testNdx < DE_LENGTH_OF_ARRAY(blendEquationStates); testNdx++)
		{
			FOR_EACH_VERIFIER(normalVerifiers, addChild(new BlendEquationTestCase			(m_context, verifier, (std::string(blendEquationStates[testNdx].name) +				+ verifier->getTestNamePostfix()).c_str(),		blendEquationStates[testNdx].description,	blendEquationStates[testNdx].target,	blendEquationStates[testNdx].initialValue)));
			FOR_EACH_VERIFIER(normalVerifiers, addChild(new BlendEquationSeparateTestCase	(m_context, verifier, (std::string(blendEquationStates[testNdx].name) + "_separate"	+ verifier->getTestNamePostfix()).c_str(),		blendEquationStates[testNdx].description,	blendEquationStates[testNdx].target,	blendEquationStates[testNdx].initialValue)));
		}
	}

	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ImplementationArrayTestCase			(m_context, verifier, (std::string("compressed_texture_formats")	+ verifier->getTestNamePostfix()).c_str(),	"COMPRESSED_TEXTURE_FORMATS",	GL_COMPRESSED_TEXTURE_FORMATS,		GL_NUM_COMPRESSED_TEXTURE_FORMATS,	0)));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ImplementationArrayTestCase			(m_context, verifier, (std::string("shader_binary_formats")			+ verifier->getTestNamePostfix()).c_str(),	"SHADER_BINARY_FORMATS",		GL_SHADER_BINARY_FORMATS,			GL_NUM_SHADER_BINARY_FORMATS,		0)));

	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new BufferBindingTestCase				(m_context, queryType, (std::string("array_buffer_binding")			+ getQueryTypeSuffix(queryType)).c_str(),	"ARRAY_BUFFER_BINDING",			GL_ARRAY_BUFFER_BINDING,			GL_ARRAY_BUFFER)));
	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new BufferBindingTestCase				(m_context, queryType, (std::string("element_array_buffer_binding")	+ getQueryTypeSuffix(queryType)).c_str(),	"ELEMENT_ARRAY_BUFFER_BINDING",	GL_ELEMENT_ARRAY_BUFFER_BINDING,	GL_ELEMENT_ARRAY_BUFFER)));

	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new CurrentProgramBindingTestCase		(m_context, queryType, (std::string("current_program_binding")		+ getQueryTypeSuffix(queryType)).c_str(),	"CURRENT_PROGRAM")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new StencilClearValueTestCase			(m_context, verifier, (std::string("stencil_clear_value")			+ verifier->getTestNamePostfix()).c_str(),	"STENCIL_CLEAR_VALUE")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ActiveTextureTestCase				(m_context, verifier, (std::string("active_texture")				+ verifier->getTestNamePostfix()).c_str(),	"ACTIVE_TEXTURE")));
	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new RenderbufferBindingTestCase			(m_context, queryType, (std::string("renderbuffer_binding")			+ getQueryTypeSuffix(queryType)).c_str(),	"RENDERBUFFER_BINDING")));

	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new TextureBindingTestCase				(m_context, queryType, (std::string("texture_binding_2d")			+ getQueryTypeSuffix(queryType)).c_str(),	"TEXTURE_BINDING_2D",			GL_TEXTURE_BINDING_2D,			GL_TEXTURE_2D)));
	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new TextureBindingTestCase				(m_context, queryType, (std::string("texture_binding_cube_map")		+ getQueryTypeSuffix(queryType)).c_str(),	"TEXTURE_BINDING_CUBE_MAP",		GL_TEXTURE_BINDING_CUBE_MAP,	GL_TEXTURE_CUBE_MAP)));

	FOR_EACH_QUERYTYPE(queryTypes,     addChild(new FrameBufferBindingTestCase			(m_context, queryType, (std::string("framebuffer_binding")			+ getQueryTypeSuffix(queryType)).c_str(),	"DRAW_FRAMEBUFFER_BINDING and READ_FRAMEBUFFER_BINDING")));
	FOR_EACH_VERIFIER(normalVerifiers, addChild(new ImplementationColorReadTestCase		(m_context, verifier, (std::string("implementation_color_read")		+ verifier->getTestNamePostfix()).c_str(),	"IMPLEMENTATION_COLOR_READ_TYPE and IMPLEMENTATION_COLOR_READ_FORMAT")));
}